

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::GenerateCallProfiling
          (Lowerer *this,ProfileId profileId,InlineCacheIndex inlineCacheIndex,Opnd *retval,
          Opnd *calleeFunctionObjOpnd,Opnd *callInfo,bool returnTypeOnly,Instr *callInstr,
          Instr *insertAfter)

{
  Func *func;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  MemRefOpnd *opnd;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  HelperCallOpnd *this_00;
  IntConstOpnd *pIVar9;
  JnHelperMethod fnHelper;
  LowererMD *this_01;
  undefined1 local_98 [8];
  AutoReuseOpnd a;
  AutoReuseOpnd b;
  AddrOpnd *local_40;
  
  bVar3 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1290,"(m_func->DoSimpleJitDynamicProfile())",
                       "m_func->DoSimpleJitDynamicProfile()");
    if (!bVar3) goto LAB_005ccf49;
    *puVar6 = 0;
  }
  if (callInstr->m_opcode != CALL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1294,"(callInstr->m_opcode == Js::OpCode::CALL)",
                       "callInstr->m_opcode == Js::OpCode::CALL");
    if (!bVar3) goto LAB_005ccf49;
    *puVar6 = 0;
  }
  func = insertAfter->m_func;
  pFVar1 = this->m_func;
  iVar5 = (*pFVar1->m_threadContextInfo->_vptr_ThreadContextInfo[5])();
  opnd = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyUint8,pFVar1,AddrOpndKindDynamicMisc);
  pRVar7 = IR::RegOpnd::New((opnd->super_Opnd).m_type,func);
  local_98 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_98,&opnd->super_Opnd,func,true);
  a.autoDelete = false;
  a.wasInUse = false;
  a._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)&a.autoDelete,&pRVar7->super_Opnd,func,true);
  InsertMove(&pRVar7->super_Opnd,&opnd->super_Opnd,callInstr,true);
  InsertMove(&opnd->super_Opnd,&pRVar7->super_Opnd,insertAfter->m_next,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&a.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
  local_40 = (AddrOpnd *)retval;
  if (retval == (Opnd *)0x0) {
    if (returnTypeOnly) {
      return insertAfter;
    }
    local_40 = IR::AddrOpnd::NewNull(func);
  }
  pIVar8 = IR::Instr::New(Call,func);
  fnHelper = HelperSimpleProfileReturnTypeCall;
  if (!returnTypeOnly) {
    fnHelper = inlineCacheIndex == 0xffffffff ^ HelperSimpleProfileCall;
  }
  this_00 = IR::HelperCallOpnd::New(fnHelper,func);
  if (pIVar8->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005ccf49;
    *puVar6 = 0;
  }
  pFVar1 = pIVar8->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005ccf49:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  pIVar8->m_src1 = &this_00->super_Opnd;
  IR::Instr::InsertAfter(insertAfter,pIVar8);
  this_01 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_01,pIVar8,callInfo);
  LowererMD::LoadHelperArgument(this_01,pIVar8,calleeFunctionObjOpnd);
  LowererMD::LoadHelperArgument(this_01,pIVar8,&local_40->super_Opnd);
  if (inlineCacheIndex != 0xffffffff && !returnTypeOnly) {
    pIVar9 = IR::Opnd::CreateInlineCacheIndexOpnd(inlineCacheIndex,func);
    LowererMD::LoadHelperArgument(this_01,pIVar8,&pIVar9->super_Opnd);
  }
  pIVar9 = IR::Opnd::CreateProfileIdOpnd(profileId,func);
  LowererMD::LoadHelperArgument(this_01,pIVar8,&pIVar9->super_Opnd);
  pRVar7 = IR::Opnd::CreateFramePointerOpnd(func);
  LowererMD::LoadHelperArgument(this_01,pIVar8,&pRVar7->super_Opnd);
  pIVar8 = LowererMD::LowerCall(this_01,pIVar8,0);
  return pIVar8;
}

Assistant:

IR::Instr*
Lowerer::GenerateCallProfiling(Js::ProfileId profileId, Js::InlineCacheIndex inlineCacheIndex, IR::Opnd* retval, IR::Opnd*calleeFunctionObjOpnd, IR::Opnd* callInfo, bool returnTypeOnly, IR::Instr*callInstr,IR::Instr*insertAfter)
{
    // This should only ever happen in profiling simplejit
    Assert(m_func->DoSimpleJitDynamicProfile());

    // Make sure they gave us the correct call instruction
#if defined(_M_IX86) || defined(_M_X64)
    Assert(callInstr->m_opcode == Js::OpCode::CALL);
#elif defined(_M_ARM)
    Assert(callInstr->m_opcode == Js::OpCode::BLX);
#elif defined(_M_ARM64)
    Assert(callInstr->m_opcode == Js::OpCode::BLR);
#endif
    Func*const func = insertAfter->m_func;

    {
        // First, we should save the implicit call flags
        const auto starFlag = GetImplicitCallFlagsOpnd();
        const auto saveOpnd = IR::RegOpnd::New(starFlag->GetType(), func);

        IR::AutoReuseOpnd a(starFlag, func), b(saveOpnd, func);
        //Save the flags (before call) and restore them (after the call)
        this->InsertMove(saveOpnd, starFlag, callInstr);
        // Note: On arm this is slightly inefficient because it forces a reload of the memory location to a reg (whereas x86 can load straight from hard-coded memory into a reg)
        //    But it works and making it not reload the memory location would force more refactoring.
        this->InsertMove(starFlag, saveOpnd, insertAfter->m_next);
    }

    // Profile a call that just happened: push some extra info on the stack and call the helper

    if (!retval)
    {
        if (returnTypeOnly)
        {
            // If we are only supposed to profile the return type but don't use the return value, we might
            // as well do nothing!
            return insertAfter;
        }
        retval = IR::AddrOpnd::NewNull(func);
    }

    IR::Instr* profileCall = IR::Instr::New(Js::OpCode::Call, func);

    bool needInlineCacheIndex;
    IR::JnHelperMethod helperMethod;
    if (returnTypeOnly)
    {
        needInlineCacheIndex = false;
        helperMethod = IR::HelperSimpleProfileReturnTypeCall;
    }
    else if(inlineCacheIndex == Js::Constants::NoInlineCacheIndex)
    {
        needInlineCacheIndex = false;
        helperMethod = IR::HelperSimpleProfileCall_DefaultInlineCacheIndex;
    }
    else
    {
        needInlineCacheIndex = true;
        helperMethod = IR::HelperSimpleProfileCall;
    }
    profileCall->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));

    insertAfter->InsertAfter(profileCall);

    m_lowererMD.LoadHelperArgument(profileCall, callInfo);
    m_lowererMD.LoadHelperArgument(profileCall, calleeFunctionObjOpnd);
    m_lowererMD.LoadHelperArgument(profileCall, retval);
    if(needInlineCacheIndex)
    {
        m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateInlineCacheIndexOpnd(inlineCacheIndex, func));
    }
    m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateProfileIdOpnd(profileId, func));
    // Push the frame pointer so that the profiling call can grab the stack layout
    m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateFramePointerOpnd(func));

    // No args: the helper is stdcall
    return m_lowererMD.LowerCall(profileCall, 0);
}